

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RandJoinClauseSyntax::setChild
          (RandJoinClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  Token TVar3;
  long lStack_20;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    lStack_20 = 0x38;
    if (pSVar2 == (SyntaxNode *)0x0) {
      pSVar2 = (SyntaxNode *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
    }
  }
  else if (index == 1) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar2 = (SyntaxNode *)TVar3.info;
    uVar1 = TVar3._0_8_;
    (this->join).kind = (short)uVar1;
    (this->join).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->join).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->join).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_20 = 0x30;
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar2 = (SyntaxNode *)TVar3.info;
    uVar1 = TVar3._0_8_;
    (this->rand).kind = (short)uVar1;
    (this->rand).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->rand).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->rand).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_20 = 0x20;
  }
  *(SyntaxNode **)((long)&(this->super_SyntaxNode).kind + lStack_20) = pSVar2;
  return;
}

Assistant:

void RandJoinClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: rand = child.token(); return;
        case 1: join = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}